

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
* duckdb::
  StringMapType<duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  ::CreateEmpty(ArenaAllocator *allocator)

{
  OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *pOVar1;
  
  pOVar1 = (OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
            *)operator_new(0x48);
  pOVar1->allocator = &allocator->arena_allocator;
  (pOVar1->map)._M_h._M_buckets = &(pOVar1->map)._M_h._M_single_bucket;
  (pOVar1->map)._M_h._M_bucket_count = 1;
  (pOVar1->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pOVar1->map)._M_h._M_element_count = 0;
  (pOVar1->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pOVar1->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (pOVar1->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pOVar1->free_type = DOES_NOT_REQUIRE_FREE;
  return pOVar1;
}

Assistant:

static TYPE *CreateEmpty(ArenaAllocator &allocator) {
		return new TYPE(allocator);
	}